

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Descriptor *pDVar3;
  bool bVar4;
  CppStringType CVar5;
  DescriptorPool *pDVar6;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>
  ppTVar7;
  TypeInfo *this_00;
  long lVar8;
  pointer __p;
  FieldDescriptor *pFVar9;
  pointer __p_00;
  OneofDescriptor *pOVar10;
  char *pcVar11;
  DynamicMessage *this_01;
  Reflection *this_02;
  int j;
  int iVar12;
  DescriptorPool *pDVar13;
  long lVar14;
  undefined *puVar15;
  int __c;
  int i_1;
  uint uVar16;
  ulong uVar17;
  uint32_t uVar18;
  int iVar19;
  uint32_t uVar20;
  int i;
  int iVar21;
  Descriptor *type_local;
  DynamicMessageFactory *local_88;
  long local_80;
  ReflectionSchema local_78;
  
  type_local = type;
  if (((this->delegate_to_generated_factory_ != true) ||
      (pDVar13 = type->file_->pool_, pDVar6 = DescriptorPool::generated_pool(), pDVar13 != pDVar6))
     || (this_01 = (DynamicMessage *)MessageFactory::TryGetGeneratedPrototype(type),
        this_01 == (DynamicMessage *)0x0)) {
    ppTVar7 = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
              ::
              operator[]<google::protobuf::Descriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
                          *)&this->prototypes_,&type_local);
    if (*ppTVar7 == (TypeInfo *)0x0) {
      this_00 = (TypeInfo *)operator_new(0xa0);
      TypeInfo::TypeInfo(this_00);
      *ppTVar7 = this_00;
      (this_00->class_data).descriptor = type_local;
      (this_00->class_data).super_ClassData.is_dynamic = true;
      pDVar13 = this->pool_;
      if (pDVar13 == (DescriptorPool *)0x0) {
        pDVar13 = type_local->file_->pool_;
      }
      this_00->pool = pDVar13;
      this_00->factory = this;
      local_80 = (long)type_local->real_oneof_decl_count_;
      lVar8 = type_local->field_count_ + local_80;
      uVar17 = lVar8 * 4;
      if ((int)lVar8 < 0) {
        uVar17 = 0xffffffffffffffff;
      }
      local_88 = this;
      __p = (pointer)operator_new__(uVar17);
      std::__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>::reset
                ((__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *)
                 &this_00->offsets,__p);
      this_00->has_bits_offset = -1;
      uVar16 = 0;
      for (lVar8 = 0; uVar17 = (ulong)type_local->field_count_, lVar8 < (long)uVar17;
          lVar8 = lVar8 + 1) {
        pFVar9 = Descriptor::field(type_local,(int)lVar8);
        bVar4 = internal::cpp::HasHasbit(pFVar9);
        if ((bVar4) &&
           (((bVar4 = FieldDescriptor::has_presence(pFVar9), pDVar3 = type_local, bVar4 ||
             (pFVar9->containing_type_ == (Descriptor *)0x0)) ||
            ((pFVar9->containing_type_->options_->field_0)._impl_.map_entry_ == false)))) {
          if (this_00->has_bits_offset == -1) {
            this_00->has_bits_offset = 0x20;
            uVar17 = (long)type_local->field_count_ * 4;
            if ((long)type_local->field_count_ < 0) {
              uVar17 = 0xffffffffffffffff;
            }
            __p_00 = (pointer)operator_new__(uVar17);
            for (lVar14 = 0; lVar14 < pDVar3->field_count_; lVar14 = lVar14 + 1) {
              __p_00[lVar14] = 0xffffffff;
            }
            std::__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>::reset
                      ((__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *)
                       &this_00->has_bits_indices,__p_00);
          }
          (this_00->has_bits_indices)._M_t.
          super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
          super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar8] = uVar16;
          uVar16 = uVar16 + 1;
        }
      }
      if ((int)uVar16 < 1) {
        uVar20 = 0x20;
      }
      else {
        iVar19 = ((int)(uVar16 + 0x1f) / 0x20) * 4 + 0x27;
        uVar20 = iVar19 - iVar19 % 8;
      }
      if (0 < (int)local_80) {
        this_00->oneof_case_offset = uVar20;
        iVar19 = uVar20 + (int)local_80 * 4 + 7;
        uVar20 = iVar19 - iVar19 % 8;
      }
      if (type_local->extension_range_count_ < 1) {
        uVar18 = 0xffffffff;
      }
      else {
        uVar18 = uVar20;
        uVar20 = (uVar20 + 0x1f) - (int)(uVar20 + 0x1f) % 8;
      }
      this_00->extensions_offset = uVar18;
      for (lVar8 = 0; lVar8 < (int)uVar17; lVar8 = lVar8 + 1) {
        pFVar9 = Descriptor::field(type_local,(int)lVar8);
        bVar4 = anon_unknown_0::InRealOneof(pFVar9);
        if (!bVar4) {
          pFVar9 = Descriptor::field(type_local,(int)lVar8);
          bVar4 = FieldDescriptor::is_repeated(pFVar9);
          iVar19 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar9->type_ * 4);
          if (bVar4) {
            iVar21 = 8;
            iVar12 = 0x10;
            if (7 < iVar19 - 1U) {
              if (iVar19 == 9) {
                CVar5 = FieldDescriptor::cpp_string_type(pFVar9);
                uVar16 = CVar5 - kView;
                if (uVar16 < 3) {
                  puVar15 = &DAT_003285d8;
                  goto LAB_0019d6d4;
                }
              }
              else if (iVar19 == 10) {
                bVar4 = FieldDescriptor::is_map(pFVar9);
                iVar12 = 0x18;
                if (bVar4) {
                  iVar12 = 0x30;
                }
                goto LAB_0019d6d7;
              }
              goto switchD_0019d699_default;
            }
          }
          else {
            iVar21 = 4;
            iVar12 = 4;
            switch(iVar19) {
            case 1:
            case 3:
            case 6:
            case 8:
              break;
            case 2:
            case 4:
            case 5:
            case 10:
              iVar21 = 8;
              iVar12 = iVar21;
              break;
            case 7:
              iVar21 = 1;
              iVar12 = iVar21;
              break;
            case 9:
              CVar5 = FieldDescriptor::cpp_string_type(pFVar9);
              uVar16 = CVar5 - kView;
              if (2 < uVar16) goto switchD_0019d699_default;
              puVar15 = &DAT_003285e4;
LAB_0019d6d4:
              iVar12 = *(int *)(puVar15 + (ulong)uVar16 * 4);
LAB_0019d6d7:
              iVar21 = 8;
              break;
            default:
switchD_0019d699_default:
              absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                        ((LogMessageDebugFatal *)&local_78,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/dynamic_message.cc"
                         ,0x102);
              absl::lts_20250127::log_internal::LogMessage::operator<<
                        ((LogMessage *)&local_78,(char (*) [16])"Can\'t get here.");
              absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                        ((LogMessageDebugFatal *)&local_78);
              iVar21 = 0;
              iVar12 = 0;
            }
          }
          iVar19 = uVar20 + iVar21 + -1;
          uVar16 = iVar19 - iVar19 % iVar21;
          __p[lVar8] = uVar16;
          uVar20 = uVar16 + iVar12;
        }
        uVar17 = (ulong)(uint)type_local->field_count_;
      }
      for (lVar8 = 0; (int)lVar8 < type_local->real_oneof_decl_count_; lVar8 = lVar8 + 1) {
        uVar16 = (uVar20 + 7) - (int)(uVar20 + 7) % 8;
        __p[type_local->field_count_ + lVar8] = uVar16;
        uVar20 = uVar16 + 8;
      }
      this_00->weak_field_map_offset = -1;
      (this_00->class_data).super_ClassData.message_creator.allocation_size_ = uVar20;
      (this_00->class_data).super_ClassData.message_creator.tag_ = kFunc;
      (this_00->class_data).super_ClassData.message_creator.alignment_ = '\b';
      (this_00->class_data).super_ClassData.message_creator.field_3.func_ = DynamicMessage::NewImpl;
      for (iVar19 = 0; iVar19 < type_local->real_oneof_decl_count_; iVar19 = iVar19 + 1) {
        pcVar11 = (char *)0x0;
        while( true ) {
          pOVar10 = Descriptor::real_oneof_decl(type_local,iVar19);
          iVar21 = (int)pcVar11;
          if (pOVar10->field_count_ <= iVar21) break;
          pOVar10 = Descriptor::real_oneof_decl(type_local,iVar19);
          pFVar9 = OneofDescriptor::field(pOVar10,iVar21);
          pcVar11 = FieldDescriptor::index(pFVar9,pcVar11,__c);
          __p[(int)pcVar11] = 0x40000000;
          pcVar11 = (char *)(ulong)(iVar21 + 1);
        }
      }
      this_01 = (DynamicMessage *)operator_new((long)(int)uVar20);
      memset(this_01,0,(long)(int)uVar20);
      DynamicMessage::DynamicMessage(this_01,this_00,false);
      local_78.default_instance_ = (Message *)(this_00->class_data).super_ClassData.prototype;
      local_78.offsets_ =
           (this_00->offsets)._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
      local_78.has_bit_indices_ =
           (this_00->has_bits_indices)._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
      local_78.has_bits_offset_ = this_00->has_bits_offset;
      uVar1 = this_00->oneof_case_offset;
      uVar2 = this_00->extensions_offset;
      local_78.oneof_case_offset_ = uVar1;
      local_78.extensions_offset_ = uVar2;
      local_78.object_size_ = (this_00->class_data).super_ClassData.message_creator.allocation_size_
      ;
      local_78.weak_field_map_offset_ = this_00->weak_field_map_offset;
      local_78.inlined_string_indices_ = (uint32_t *)0x0;
      local_78.inlined_string_donated_offset_ = 0;
      local_78.split_offset_ = -1;
      local_78.sizeof_split_ = -1;
      this_02 = (Reflection *)operator_new(0x70);
      Reflection::Reflection
                (this_02,(this_00->class_data).descriptor,&local_78,this_00->pool,
                 &local_88->super_MessageFactory);
      (this_00->class_data).reflection = this_02;
      DynamicMessage::CrossLinkPrototypes(this_01);
    }
    else {
      this_01 = (DynamicMessage *)((*ppTVar7)->class_data).super_ClassData.prototype;
    }
  }
  return &this_01->super_Message;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* PROTOBUF_NONNULL type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    const Message* result = MessageFactory::TryGetGeneratedPrototype(type);
    if (result != nullptr) return result;
    // Otherwise, we will create it dynamically so keep going.
  }

  const TypeInfo** target = &prototypes_[type];
  if (*target != nullptr) {
    // Already exists.
    return static_cast<const Message*>((*target)->class_data.prototype);
  }

  TypeInfo* type_info = new TypeInfo;
  *target = type_info;

  type_info->class_data.descriptor = type;
  type_info->class_data.is_dynamic = true;
  type_info->pool = (pool_ == nullptr) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to Reflection's constructor.
  // This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.
  int real_oneof_count = type->real_oneof_decl_count();

  // Compute size and offsets.
  uint32_t* offsets = new uint32_t[type->field_count() + real_oneof_count];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  type_info->has_bits_offset = -1;
  int max_hasbit = 0;
  for (int i = 0; i < type->field_count(); i++) {
    const FieldDescriptor* field = type->field(i);

    // If a field has hasbits, it could be either an explicit-presence or
    // implicit-presence field. Explicit presence fields will have "true
    // hasbits" where hasbit is set iff field is present. Implicit presence
    // fields will have "hint hasbits" where
    // - if hasbit is unset, field is not present.
    // - if hasbit is set, field is present if it is also nonempty.
    if (internal::cpp::HasHasbit(field)) {
      // TODO: b/112602698 - during Python textproto serialization, MapEntry
      // messages may be generated from DynamicMessage on the fly. C++
      // implementations of MapEntry messages always have hasbits, but
      // has_presence return values might be different depending on how field
      // presence is set. For MapEntrys, has_presence returns true for
      // explicit-presence (proto2) messages and returns false for
      // implicit-presence (proto3) messages.
      //
      // In the case of implicit presence, there is a potential inconsistency in
      // code behavior between C++ and Python:
      // - If C++ implementation is linked, hasbits are always generated for
      //   MapEntry messages, and MapEntry messages will behave like explicit
      //   presence.
      // - If C++ implementation is not linked, Python defaults to the
      //   DynamicMessage implementation for MapEntrys which traditionally does
      //   not assume the presence of hasbits, so the default Python behavior
      //   for MapEntry messages (by default C++ implementations are not linked)
      //   will fall back to the DynamicMessage implementation and behave like
      //   implicit presence.
      // This is an inconsistency and this if-condition preserves it.
      //
      // Longer term, we want to get rid of this additional if-check of
      // IsMapEntryField. It might take one or more breaking changes and more
      // consensus gathering & clarification though.
      if (!field->has_presence() && IsMapEntryField(field)) {
        continue;
      }

      if (type_info->has_bits_offset == -1) {
        // At least one field in the message requires a hasbit, so allocate
        // hasbits.
        type_info->has_bits_offset = size;
        uint32_t* has_bits_indices = new uint32_t[type->field_count()];
        for (int j = 0; j < type->field_count(); j++) {
          // Initialize to -1, fields that need a hasbit will overwrite.
          has_bits_indices[j] = static_cast<uint32_t>(-1);
        }
        type_info->has_bits_indices.reset(has_bits_indices);
      }
      type_info->has_bits_indices[i] = max_hasbit++;
    }
  }

  if (max_hasbit > 0) {
    int has_bits_array_size = DivideRoundingUp(max_hasbit, bitsizeof(uint32_t));
    size += has_bits_array_size * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The oneof_case, if any. It is an array of uint32s.
  if (real_oneof_count > 0) {
    type_info->oneof_case_offset = size;
    size += real_oneof_count * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  //
  // TODO:  Optimize the order of fields to minimize padding.
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    // Oneof fields do not use any space.
    if (!InRealOneof(type->field(i))) {
      int field_size = FieldSpaceUsed(type->field(i));
      size = AlignTo(size, std::min(kSafeAlignment, field_size));
      offsets[i] = size;
      size += field_size;
    }
  }

  // The oneofs.
  for (int i = 0; i < type->real_oneof_decl_count(); i++) {
    size = AlignTo(size, kSafeAlignment);
    offsets[type->field_count() + i] = size;
    size += kMaxOneofUnionSize;
  }

  type_info->weak_field_map_offset = -1;

  type_info->class_data.message_creator =
      internal::MessageCreator(DynamicMessage::NewImpl, size, kSafeAlignment);

  // Construct the reflection object.

  // Compute the size of default oneof instance and offsets of default
  // oneof fields.
  for (int i = 0; i < type->real_oneof_decl_count(); i++) {
    for (int j = 0; j < type->real_oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->real_oneof_decl(i)->field(j);
      // oneof fields are not accessed through offsets, but we still have the
      // entry for each.
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      offsets[field->index()] = internal::kInvalidFieldOffsetTag;
    }
  }

  // Allocate the prototype fields.
  void* base = operator new(size);
  memset(base, 0, size);

  // We have already locked the factory so we should not lock in the constructor
  // of dynamic message to avoid dead lock.
  DynamicMessage* prototype = new (base) DynamicMessage(type_info, false);

  internal::ReflectionSchema schema = {
      static_cast<const Message*>(type_info->class_data.prototype),
      type_info->offsets.get(),
      type_info->has_bits_indices.get(),
      type_info->has_bits_offset,
      type_info->extensions_offset,
      type_info->oneof_case_offset,
      static_cast<int>(type_info->class_data.allocation_size()),
      type_info->weak_field_map_offset,
      nullptr,  // inlined_string_indices_
      0,        // inlined_string_donated_offset_
      -1,       // split_offset_
      -1,       // sizeof_split_
  };

  type_info->class_data.reflection = new Reflection(
      type_info->class_data.descriptor, schema, type_info->pool, this);

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}